

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::anon_unknown_105::ReadStringNoArena
                 (MessageLite *param_1,char *ptr,ParseContext *ctx,uint32_t param_4,
                 TcParseTableBase *param_5,ArenaStringPtr *field)

{
  MessageLite *ptr_00;
  uint32_t size;
  string *s;
  char *pcVar1;
  MessageLite *local_28;
  
  local_28 = param_1;
  size = ReadSize((char **)&local_28);
  ptr_00 = local_28;
  if (local_28 == (MessageLite *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)ctx,(Arena *)0x0);
    pcVar1 = EpsCopyInputStream::ReadString((EpsCopyInputStream *)ptr,(char *)ptr_00,size,s);
  }
  return pcVar1;
}

Assistant:

PROTOBUF_NOINLINE
const char* ReadStringNoArena(MessageLite* /*msg*/, const char* ptr,
                              ParseContext* ctx, uint32_t /*aux_idx*/,
                              const TcParseTableBase* /*table*/,
                              ArenaStringPtr& field) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, field.MutableNoCopy(nullptr));
}